

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O1

EncodingState *
ZXing::Aztec::LatchAndAppend
          (EncodingState *__return_storage_ptr__,EncodingState *state,int mode,int value)

{
  int iVar1;
  uint uVar2;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  Token local_44;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> local_40;
  
  iVar1 = state->bitCount;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&local_40,&state->tokens);
  if (state->mode != mode) {
    uVar2 = *(uint *)(LATCH_TABLE + (long)mode * 4 + (long)state->mode * 0x14);
    local_44 = (Token)((uVar2 & 0xffff) - (uVar2 & 0xffff0000));
    std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
    emplace_back<ZXing::Aztec::Token>(&local_40,&local_44);
    iVar1 = iVar1 + ((int)uVar2 >> 0x10);
  }
  uVar2 = mode == 2 ^ 5;
  local_44 = (Token)((value & 0xffffU) + uVar2 * -0x10000);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
  emplace_back<ZXing::Aztec::Token>(&local_40,&local_44);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&__return_storage_ptr__->tokens,&local_40);
  __return_storage_ptr__->mode = mode;
  __return_storage_ptr__->binaryShiftByteCount = 0;
  __return_storage_ptr__->bitCount = iVar1 + uVar2;
  if (local_40.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static EncodingState LatchAndAppend(const EncodingState& state, int mode, int value)
{
	//assert binaryShiftByteCount == 0;
	int bitCount = state.bitCount;
	auto tokens = state.tokens;
	if (mode != state.mode) {
		int latch = LATCH_TABLE[state.mode][mode];
		tokens.push_back(Token::CreateSimple(latch & 0xFFFF, latch >> 16));
		bitCount += latch >> 16;
	}
	int latchModeBitCount = mode == MODE_DIGIT ? 4 : 5;
	tokens.push_back(Token::CreateSimple(value, latchModeBitCount));
	return EncodingState{ tokens, mode, 0, bitCount + latchModeBitCount };
}